

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O0

pair<long,_bool> __thiscall
sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
          (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this,
          unsigned_long_long *key)

{
  bool bVar1;
  undefined8 extraout_RDX;
  unsigned_long_long *in_RSI;
  long *in_RDI;
  pair<long,_int> pVar2;
  pair<long,_bool> pVar3;
  pair<long,_bool> pVar4;
  int j;
  int i;
  node *x;
  locType pos;
  long ret;
  uint5 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5d;
  byte in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  less<unsigned_long_long> local_6b;
  less<unsigned_long_long> local_6a;
  less<unsigned_long_long> local_69;
  int local_68;
  int local_64;
  long local_60;
  long local_58;
  long local_50;
  int local_48;
  undefined4 local_3c;
  pair<long,_int> local_38;
  undefined8 local_28;
  unsigned_long_long *local_20;
  pair<long,_bool> local_10;
  
  if ((int)*in_RDI == 0) {
    local_3c = 0;
    pVar2 = std::make_pair<long&,int>
                      (in_RDI,(int *)CONCAT17(in_stack_ffffffffffffff5f,
                                              CONCAT16(in_stack_ffffffffffffff5e,
                                                       CONCAT15(in_stack_ffffffffffffff5d,
                                                                in_stack_ffffffffffffff58))));
    local_50 = pVar2.first;
    local_48 = pVar2.second;
    local_38.first = local_50;
    local_38.second = local_48;
    std::pair<long,_bool>::pair<long,_int,_true>(&local_10,&local_38);
    pVar3._8_8_ = extraout_RDX;
    pVar3.first = local_10.first;
  }
  else {
    local_58 = in_RDI[1];
    local_20 = in_RSI;
    for (local_64 = 0; local_64 < (int)*in_RDI; local_64 = local_64 + 1) {
      local_60 = (**(code **)(*(long *)in_RDI[2] + 0x10))((long *)in_RDI[2],&local_58);
      local_68 = 0;
      while( true ) {
        in_stack_ffffffffffffff5f = false;
        if (local_68 < *(int *)(local_60 + 0x640)) {
          in_stack_ffffffffffffff5f =
               std::less<unsigned_long_long>::operator()
                         (&local_69,(unsigned_long_long *)(local_60 + 0x328 + (long)local_68 * 8),
                          local_20);
        }
        if ((bool)in_stack_ffffffffffffff5f == false) break;
        local_68 = local_68 + 1;
      }
      if (local_64 < (int)*in_RDI + -1) {
        in_stack_ffffffffffffff5e = 0;
        if (local_68 < *(int *)(local_60 + 0x640)) {
          bVar1 = std::less<unsigned_long_long>::operator()
                            (&local_6a,local_20,
                             (unsigned_long_long *)(local_60 + 0x328 + (long)local_68 * 8));
          in_stack_ffffffffffffff5e = bVar1 ^ 0xff;
        }
        if ((in_stack_ffffffffffffff5e & 1) == 0) {
          local_58 = *(long *)(local_60 + (long)local_68 * 8);
        }
        else {
          local_58 = *(long *)(local_60 + (long)(local_68 + 1) * 8);
        }
      }
    }
    bVar1 = true;
    if (local_68 != *(int *)(local_60 + 0x640)) {
      bVar1 = std::less<unsigned_long_long>::operator()
                        (&local_6b,local_20,
                         (unsigned_long_long *)(local_60 + 0x328 + (long)local_68 * 8));
    }
    if (bVar1 == false) {
      local_28 = *(undefined8 *)(local_60 + (long)local_68 * 8);
      pVar3 = std::make_pair<long&,bool>
                        (in_RDI,(bool *)CONCAT17(in_stack_ffffffffffffff5f,
                                                 CONCAT16(in_stack_ffffffffffffff5e,
                                                          (uint6)in_stack_ffffffffffffff58)));
      local_10.second = pVar3.second;
    }
    else {
      pVar3 = std::make_pair<long&,bool>
                        (in_RDI,(bool *)CONCAT17(in_stack_ffffffffffffff5f,
                                                 CONCAT16(in_stack_ffffffffffffff5e,
                                                          CONCAT15(bVar1,in_stack_ffffffffffffff58))
                                                ));
      local_10.second = pVar3.second;
    }
  }
  local_10.first = pVar3.first;
  pVar4._9_7_ = pVar3._9_7_;
  pVar4.second = local_10.second;
  pVar4.first = local_10.first;
  return pVar4;
}

Assistant:

std::pair<T, bool> find(const Key &key) {
            T ret;
            if (!depth)return std::make_pair(ret, 0);
            locType pos = root;
            node *x;
            int i, j;
            for (i = 0; i < depth; ++i) {
                x = file->read(pos);
                for (j = 0; j < x->sz && Compare()(x->keyvalue[j], key); ++j);
                if (i < depth - 1) {
                    if (j < x->sz && !Compare()(key, x->keyvalue[j]))pos = x->pointer[j + 1];
                    else pos = x->pointer[j];
                }
            }
            if (j == x->sz || Compare()(key, x->keyvalue[j]))
                return std::make_pair(ret, false);
            ret = x->val[j];
            return std::make_pair(ret, true);
        }